

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode cr_mime_resume_from(Curl_easy *data,Curl_creader *reader,curl_off_t offset)

{
  void *pvVar1;
  curl_mimepart *part_00;
  bool bVar2;
  CURLcode CVar3;
  size_t sVar4;
  curl_mimepart *part;
  size_t bufsize;
  curl_off_t passed;
  long lVar5;
  char scratch [4096];
  _Bool local_1049;
  Curl_easy *local_1048;
  long local_1040;
  char local_1038 [4104];
  
  if (0 < offset) {
    pvVar1 = reader->ctx;
    lVar5 = 0;
    local_1048 = data;
    local_1040 = offset;
    do {
      bufsize = 0x1000;
      if (local_1040 - lVar5 < 0x1001) {
        bufsize = curlx_sotouz(local_1040 - lVar5);
      }
      part_00 = *(curl_mimepart **)((long)pvVar1 + 0x20);
      do {
        local_1049 = false;
        sVar4 = readback_part(part_00,local_1038,bufsize,&local_1049);
      } while (sVar4 == 0xfffffffffffffffe);
      lVar5 = lVar5 + sVar4;
      if (bufsize <= sVar4 - 1) {
        bVar2 = false;
        Curl_failf(local_1048,"Could only read %ld bytes from the mime post",lVar5);
        CVar3 = CURLE_READ_ERROR;
        goto LAB_00141d17;
      }
    } while (lVar5 < local_1040);
    lVar5 = *(long *)((long)pvVar1 + 0x28);
    bVar2 = true;
    CVar3 = CURLE_READ_ERROR;
    if ((0 < lVar5) &&
       (*(long *)((long)pvVar1 + 0x28) = lVar5 - local_1040,
       lVar5 - local_1040 == 0 || lVar5 < local_1040)) {
      bVar2 = false;
      Curl_failf(local_1048,"Mime post already completely uploaded");
      CVar3 = CURLE_PARTIAL_FILE;
    }
LAB_00141d17:
    if (!bVar2) {
      return CVar3;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_mime_resume_from(struct Curl_easy *data,
                                    struct Curl_creader *reader,
                                    curl_off_t offset)
{
  struct cr_mime_ctx *ctx = reader->ctx;

  if(offset > 0) {
    curl_off_t passed = 0;

    do {
      char scratch[4*1024];
      size_t readthisamountnow =
        (offset - passed > (curl_off_t)sizeof(scratch)) ?
        sizeof(scratch) :
        curlx_sotouz(offset - passed);
      size_t nread;

      nread = Curl_mime_read(scratch, 1, readthisamountnow, ctx->part);
      passed += (curl_off_t)nread;
      if((nread == 0) || (nread > readthisamountnow)) {
        /* this checks for greater-than only to make sure that the
           CURL_READFUNC_ABORT return code still aborts */
        failf(data, "Could only read %" FMT_OFF_T
              " bytes from the mime post", passed);
        return CURLE_READ_ERROR;
      }
    } while(passed < offset);

    /* now, decrease the size of the read */
    if(ctx->total_len > 0) {
      ctx->total_len -= offset;

      if(ctx->total_len <= 0) {
        failf(data, "Mime post already completely uploaded");
        return CURLE_PARTIAL_FILE;
      }
    }
    /* we have passed, proceed as normal */
  }
  return CURLE_OK;
}